

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

FISoundChannel * S_GetChannel(void *syschan)

{
  FSoundChan *local_18;
  FSoundChan *chan;
  void *syschan_local;
  
  if (FreeChannels == (FSoundChan *)0x0) {
    local_18 = (FSoundChan *)operator_new(0x68);
    FSoundChan::FSoundChan(local_18);
    memset(local_18,0,0x68);
  }
  else {
    local_18 = FreeChannels;
    S_UnlinkChannel(FreeChannels);
  }
  S_LinkChannel(local_18,&Channels);
  (local_18->super_FISoundChannel).SysChannel = syschan;
  return &local_18->super_FISoundChannel;
}

Assistant:

FISoundChannel *S_GetChannel(void *syschan)
{
	FSoundChan *chan;

	if (FreeChannels != NULL)
	{
		chan = FreeChannels;
		S_UnlinkChannel(chan);
	}
	else
	{
		chan = new FSoundChan;
		memset(chan, 0, sizeof(*chan));
	}
	S_LinkChannel(chan, &Channels);
	chan->SysChannel = syschan;
	return chan;
}